

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.cpp
# Opt level: O0

Vector __thiscall Vector::ProjectVector(Vector *this,Vector *a)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 local_38 [8];
  Vector b;
  Vector *a_local;
  Vector *this_local;
  Vector res;
  
  b._8_8_ = a;
  Vector((Vector *)&this_local);
  Vector((Vector *)local_38);
  fVar1 = X(this);
  fVar2 = Y(this);
  fVar3 = Z(this);
  Set((Vector *)local_38,fVar1,fVar2,fVar3);
  fVar1 = X((Vector *)b._8_8_);
  fVar2 = Y((Vector *)b._8_8_);
  fVar3 = Z((Vector *)b._8_8_);
  Set((Vector *)&this_local,fVar1,fVar2,fVar3);
  fVar1 = Dot((Vector *)b._8_8_,(Vector *)local_38);
  fVar2 = Dot((Vector *)b._8_8_,(Vector *)b._8_8_);
  Scale((Vector *)&this_local,fVar1 / fVar2);
  return _this_local;
}

Assistant:

Vector Vector::ProjectVector(Vector &a)
{
   Vector res, b;

   b.Set(X(), Y(), Z());
   res.Set(a.X(), a.Y(), a.Z());

   res.Scale(a.Dot(b) / a.Dot(a));

   return res;
}